

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTest.cpp
# Opt level: O2

Task * __thiscall
(anonymous_namespace)::BuildEngineTest_CycleDuringScanningFromTop_Test::TestBody()::CycleRule::
createTask(llbuild::core::BuildEngine__(void *this,BuildEngine *param_1)

{
  SimpleTask *this_00;
  _Any_data local_60;
  _Manager_type local_50;
  _Any_data local_40;
  _Manager_type local_30;
  
  this_00 = (SimpleTask *)operator_new(0x60);
  std::function<std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>_()>::
  function((function<std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>_()>
            *)&local_60,
           (function<std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>_()>
            *)((long)this + 0x30));
  std::function<int_(const_std::vector<int,_std::allocator<int>_>_&)>::function
            ((function<int_(const_std::vector<int,_std::allocator<int>_>_&)> *)&local_40,
             (function<int_(const_std::vector<int,_std::allocator<int>_>_&)> *)((long)this + 0x50));
  anon_unknown.dwarf_1cf4b::SimpleTask::SimpleTask
            (this_00,(InputListingFnType *)&local_60,(ComputeFnType *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  return &this_00->super_Task;
}

Assistant:

Task* createTask(BuildEngine&) override {
      return new SimpleTask(input, compute);
    }